

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall TTD::ScriptContextTTD::~ScriptContextTTD(ScriptContextTTD *this)

{
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  *this_00;
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  *this_01;
  BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar2;
  
  (this->m_ttdPendingAsyncModList).
  super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
  .count = 0;
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_ttdTopLevelScriptLoad);
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_ttdTopLevelNewFunction);
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_ttdTopLevelEval);
  this_00 = &this->m_ttdPinnedRootFunctionSet;
  if ((this->m_ttdPinnedRootFunctionSet).ptr !=
      (BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    pBVar1 = Memory::
             RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
             ::operator->(this_00);
    Memory::
    RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::Unroot(this_00,(pBVar1->
                     super_BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ).alloc);
  }
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_ttdFunctionBodyParentMap);
  this_01 = &this->TTDWeakReferencePinSet;
  if ((this->TTDWeakReferencePinSet).ptr !=
      (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    pBVar2 = Memory::
             RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
             ::operator->(this_01);
    Memory::
    RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::Unroot(this_01,(pBVar2->
                     super_BaseDictionary<Js::RecyclableObject_*,_Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     ).alloc);
  }
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::~RecyclerRootPtr(this_01);
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->m_ttdFunctionBodyParentMap);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FunctionBody_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::~RecyclerRootPtr(this_00);
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->m_ttdTopLevelEval);
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->m_ttdTopLevelNewFunction);
  JsUtil::
  BaseDictionary<unsigned_long,_TTD::TopLevelFunctionInContextRelation,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->m_ttdTopLevelScriptLoad);
  (this->m_ttdPendingAsyncModList).
  super_ReadOnlyList<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_DefaultComparer>
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e5d48;
  JsUtil::
  List<TTD::TTDPendingAsyncBufferModification,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Reset(&this->m_ttdPendingAsyncModList);
  return;
}

Assistant:

ScriptContextTTD::~ScriptContextTTD()
    {
        this->m_ttdPendingAsyncModList.Clear();

        this->m_ttdTopLevelScriptLoad.Clear();
        this->m_ttdTopLevelNewFunction.Clear();
        this->m_ttdTopLevelEval.Clear();

        if(this->m_ttdPinnedRootFunctionSet != nullptr)
        {
            this->m_ttdPinnedRootFunctionSet.Unroot(this->m_ttdPinnedRootFunctionSet->GetAllocator());
        }

        this->m_ttdFunctionBodyParentMap.Clear();

        if(this->TTDWeakReferencePinSet != nullptr)
        {
            this->TTDWeakReferencePinSet.Unroot(this->TTDWeakReferencePinSet->GetAllocator());
        }
    }